

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

void __thiscall OpenMD::SimInfo::~SimInfo(SimInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  pointer ppSVar3;
  pointer pcVar4;
  pointer pdVar5;
  pointer ppMVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this->_vptr_SimInfo = (_func_int **)&PTR__SimInfo_00339328;
  Utils::
  deletePointers<std::map<int,OpenMD::Molecule*,std::less<int>,std::allocator<std::pair<int_const,OpenMD::Molecule*>>>>
            (&this->molecules_);
  if (this->sman_ != (SnapshotManager *)0x0) {
    (*this->sman_->_vptr_SnapshotManager[1])();
  }
  if (this->simParams_ != (Globals *)0x0) {
    (*(this->simParams_->super_DataHolder)._vptr_DataHolder[1])();
  }
  if (this->forceField_ != (ForceField *)0x0) {
    (*this->forceField_->_vptr_ForceField[1])();
  }
  piVar2 = (this->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  ppSVar3 = (this->IOIndexToIntegrableObject).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar3 != (pointer)0x0) {
    operator_delete(ppSVar3,(long)(this->IOIndexToIntegrableObject).
                                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar3
                   );
  }
  pcVar4 = (this->restFileName_)._M_dataplus._M_p;
  paVar1 = &(this->restFileName_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->reportFileName_)._M_dataplus._M_p;
  paVar1 = &(this->reportFileName_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->statFileName_)._M_dataplus._M_p;
  paVar1 = &(this->statFileName_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->dumpFileName_)._M_dataplus._M_p;
  paVar1 = &(this->dumpFileName_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->finalConfigFileName_)._M_dataplus._M_p;
  paVar1 = &(this->finalConfigFileName_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->rawMetaData_)._M_dataplus._M_p;
  paVar1 = &(this->rawMetaData_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  LocalIndexManager::~LocalIndexManager(&this->localIndexMan_);
  (this->properties_)._vptr_PropertyMap = (_func_int **)&PTR__PropertyMap_00339358;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
  ::~_Rb_tree(&(this->properties_).propMap_._M_t);
  piVar2 = (this->oneFourInteractions_).pairList_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->oneFourInteractions_).pairList_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *)&this->oneFourInteractions_);
  piVar2 = (this->oneThreeInteractions_).pairList_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->oneThreeInteractions_).pairList_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *)&this->oneThreeInteractions_);
  piVar2 = (this->oneTwoInteractions_).pairList_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->oneTwoInteractions_).pairList_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *)&this->oneTwoInteractions_);
  piVar2 = (this->excludedInteractions_).pairList_.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->excludedInteractions_).pairList_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
               *)&this->excludedInteractions_);
  pdVar5 = (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar5 != (pointer)0x0) {
    operator_delete(pdVar5,(long)(this->massFactors_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar5);
  }
  piVar2 = (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->regions_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  piVar2 = (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->identArray_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  piVar2 = (this->globalMolMembership_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->globalMolMembership_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  piVar2 = (this->globalGroupMembership_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->globalGroupMembership_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  ppMVar6 = (this->moleculeStamps_).
            super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppMVar6 != (pointer)0x0) {
    operator_delete(ppMVar6,(long)(this->moleculeStamps_).
                                  super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppMVar6
                   );
  }
  piVar2 = (this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->molStampIds_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMD::Molecule_*>,_std::_Select1st<std::pair<const_int,_OpenMD::Molecule_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  ::~_Rb_tree(&(this->molecules_)._M_t);
  this_00 = (this->randNumGen_).
            super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

SimInfo::~SimInfo() {
    Utils::deletePointers(molecules_);

    delete sman_;
    delete simParams_;
    delete forceField_;
  }